

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sym_tbl.cpp
# Opt level: O1

shared_ptr<mocker::ast::Declaration> __thiscall
mocker::SymTbl::lookUp(SymTbl *this,ScopeID *scopeID,string *identifier)

{
  int iVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar2;
  Scope *__tmp;
  iterator iVar3;
  element_type *peVar4;
  key_type *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  element_type *extraout_RDX;
  element_type *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  bool bVar7;
  shared_ptr<mocker::SymTbl::Scope> sVar8;
  shared_ptr<mocker::ast::Declaration> sVar9;
  shared_ptr<mocker::SymTbl::Scope> cur;
  SymTbl local_30;
  
  sVar8 = getScope(&local_30,scopeID);
  _Var6 = sVar8.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  do {
    if (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        == (element_type *)0x0) {
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      break;
    }
    iVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_30.root.
                      super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   in_RCX);
    this_00._M_pi =
         local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      p_Var5 = ((local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->pnt).super___weak_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar2 = p_Var5->_M_use_count;
        do {
          if (iVar2 == 0) {
            p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            break;
          }
          LOCK();
          iVar1 = p_Var5->_M_use_count;
          bVar7 = iVar2 == iVar1;
          if (bVar7) {
            p_Var5->_M_use_count = iVar2 + 1;
            iVar1 = iVar2;
          }
          iVar2 = iVar1;
          UNLOCK();
        } while (!bVar7);
      }
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar7 = true;
      }
      else {
        bVar7 = p_Var5->_M_use_count == 0;
      }
      if (bVar7) {
        peVar4 = (element_type *)0x0;
      }
      else {
        peVar4 = ((local_30.root.
                   super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 pnt).super___weak_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      bVar7 = local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    local_30.root.
                    super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           peVar4;
      local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if (bVar7) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX_00;
      }
    }
    else {
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(element_type **)
            ((long)iVar3.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
                   ._M_cur + 0x28);
      p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
                       ._M_cur + 0x30);
      (this->root).super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = p_Var5;
      _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
          _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)extraout_RDX;
        }
      }
    }
  } while (iVar3.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<mocker::ast::Declaration>_>,_true>
           ._M_cur == (__node_type *)0x0);
  if (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.root.super___shared_ptr<mocker::SymTbl::Scope,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var6._M_pi = extraout_RDX_01;
  }
  sVar9.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var6._M_pi;
  sVar9.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::Declaration>)
         sVar9.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::Declaration>
SymTbl::lookUp(const ScopeID &scopeID, const std::string &identifier) const {
  auto cur = getScope(scopeID);
  while (cur != nullptr) {
    auto iter = cur->syms.find(identifier);
    if (iter != cur->syms.end())
      return {iter->second};
    cur = cur->pnt.lock();
  }
  return {};
}